

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O3

int parsedate(char *date,time_t *output)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  int *piVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  char **what;
  char **ppcVar15;
  long lVar16;
  int i;
  ulong uVar17;
  bool bVar18;
  int len;
  int minnum;
  int hournum;
  char buf [32];
  uint local_90;
  int local_8c;
  ulong local_88;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  long *local_68;
  byte *local_60;
  byte *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar13 = 0xffffffff;
  local_74 = -1;
  local_78 = -1;
  local_8c = -1;
  bVar5 = *date;
  local_90 = 0xffffffff;
  iVar6 = -1;
  iVar14 = -1;
  if (bVar5 != 0) {
    lVar11 = 0xffffffff;
    local_90 = 0xffffffff;
    uVar17 = 0;
    local_88 = 0xffffffff;
    bVar3 = false;
    local_68 = output;
    local_60 = (byte *)date;
LAB_0012da19:
    do {
      iVar6 = Curl_isalnum((uint)bVar5);
      if (iVar6 == 0) {
        bVar5 = ((byte *)date)[1];
        date = (char *)((byte *)date + 1);
        if (bVar5 != 0) goto LAB_0012da19;
        uVar7 = 0;
      }
      else {
        uVar7 = (uint)(byte)*date;
      }
      iVar6 = Curl_isalpha(uVar7);
      if (iVar6 == 0) {
        iVar6 = Curl_isdigit((uint)(byte)*date);
        if (iVar6 != 0) {
          local_7c = 0;
          if (local_8c == -1) {
            iVar6 = __isoc99_sscanf(date,"%02d:%02d:%02d%n",&local_74,&local_78,&local_8c,&local_7c)
            ;
            if (iVar6 != 3) {
              if ((local_8c != -1) ||
                 (iVar6 = __isoc99_sscanf(date,"%02d:%02d%n",&local_74,&local_78,&local_7c),
                 iVar6 != 2)) goto LAB_0012daa7;
              local_8c = 0;
            }
            date = (char *)((byte *)date + local_7c);
          }
          else {
LAB_0012daa7:
            local_70 = uVar17;
            piVar10 = __errno_location();
            iVar6 = *piVar10;
            *piVar10 = 0;
            lVar16 = strtol(date,(char **)&local_58,10);
            uVar17 = local_70;
            iVar8 = *piVar10;
            if (iVar8 != iVar6) {
              *piVar10 = iVar6;
            }
            if (iVar8 != 0) {
              return -1;
            }
            if (lVar16 - 0x80000000U < 0xffffffff00000000) {
              return -1;
            }
            uVar7 = curlx_sltosi(lVar16);
            lVar16 = (long)local_58 - (long)date;
            if (iVar14 == -1) {
              iVar14 = -1;
              bVar2 = false;
              if (((local_60 < date) && (bVar2 = false, lVar16 == 4)) && ((int)uVar7 < 0x579)) {
                bVar5 = ((byte *)date)[-1];
                lVar16 = 4;
                if ((bVar5 != 0x2d) && (bVar5 != 0x2b)) goto LAB_0012db20;
                iVar6 = uVar7 + ((int)uVar7 / 100) * -0x28;
                iVar14 = iVar6 * -0x3c;
                if (bVar5 != 0x2b) {
                  iVar14 = iVar6 * 0x3c;
                }
                bVar2 = true;
              }
            }
            else {
LAB_0012db20:
              bVar2 = false;
            }
            if (((lVar16 == 8) && ((int)local_88 == -1)) &&
               ((uVar13 == 0xffffffff && (local_90 == 0xffffffff)))) {
              local_88 = (ulong)(uint)((int)uVar7 / 10000);
              uVar13 = (uint)(short)((short)((short)uVar7 + (short)((int)uVar7 / 10000) * -10000) /
                                     100 + -1);
              local_90 = (int)uVar7 % 100;
              bVar2 = true;
            }
            bVar1 = (bool)(local_90 == 0xffffffff & !bVar3 & ~bVar2);
            bVar18 = uVar7 - 1 < 0x1f;
            uVar12 = 0xffffffff;
            if (bVar18) {
              uVar12 = uVar7;
            }
            bVar18 = (bool)(bVar18 & bVar1);
            bVar4 = true;
            if (!bVar1) {
              uVar12 = local_90;
              bVar4 = bVar3;
            }
            date = (char *)local_58;
            local_90 = uVar12;
            if (((bVar18 || bVar2) || (!bVar4)) || ((int)local_88 != -1)) {
              bVar3 = bVar4;
              if (!bVar18 && !bVar2) {
                return -1;
              }
            }
            else {
              if ((int)uVar7 < 100) {
                if ((int)uVar7 < 0x47) {
                  uVar7 = uVar7 + 2000;
                }
                else {
                  uVar7 = uVar7 + 0x76c;
                }
              }
              local_88 = (ulong)uVar7;
              bVar3 = uVar12 != 0xffffffff;
            }
          }
        }
      }
      else {
        local_48 = 0;
        uStack_40 = 0;
        local_58 = (byte *)0x0;
        uStack_50 = 0;
        local_70 = uVar17;
        iVar6 = __isoc99_sscanf(date,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                                &local_58);
        if (iVar6 == 0) {
          sVar9 = 0;
        }
        else {
          sVar9 = strlen((char *)&local_58);
        }
        if ((int)lVar11 == -1) {
          ppcVar15 = Curl_wkday;
          if (3 < sVar9) {
            ppcVar15 = weekday;
          }
          lVar11 = 0;
          do {
            iVar6 = Curl_strcasecompare((char *)&local_58,ppcVar15[lVar11]);
            if (iVar6 != 0) goto LAB_0012dcf4;
            lVar11 = lVar11 + 1;
          } while ((int)lVar11 != 7);
          lVar11 = 0xffffffff;
        }
        if (uVar13 == 0xffffffff) {
          uVar13 = 0;
          ppcVar15 = Curl_month;
          do {
            iVar6 = Curl_strcasecompare((char *)&local_58,*ppcVar15);
            if (iVar6 != 0) goto LAB_0012dcf4;
            ppcVar15 = ppcVar15 + 1;
            uVar13 = uVar13 + 1;
          } while (uVar13 != 0xc);
          uVar13 = 0xffffffff;
        }
        if (iVar14 != -1) {
          return -1;
        }
        lVar16 = 0;
        while (iVar6 = Curl_strcasecompare((char *)&local_58,tz[0].name + lVar16), iVar6 == 0) {
          lVar16 = lVar16 + 0xc;
          if ((int)lVar16 == 0x33c) {
            return -1;
          }
        }
        iVar14 = *(int *)(tz[0].name + lVar16 + 8) * 0x3c;
LAB_0012dcf4:
        date = (char *)((byte *)date + sVar9);
        uVar17 = local_70;
      }
      bVar5 = *date;
      if ((bVar5 == 0) || (uVar7 = (uint)uVar17, uVar17 = (ulong)(uVar7 + 1), 4 < uVar7))
      goto LAB_0012de59;
    } while( true );
  }
LAB_0012de70:
  local_8c = 0;
  local_74 = 0;
  local_78 = 0;
  local_68 = output;
LAB_0012de7a:
  iVar8 = -1;
  if (((local_90 != 0xffffffff) && (uVar13 != 0xffffffff)) &&
     ((0x62e < iVar6 &&
      ((local_8c < 0x3d && local_78 < 0x3c) &&
       (local_74 < 0x18 && ((int)uVar13 < 0xc && (int)local_90 < 0x20)))))) {
    uVar7 = uVar13;
    if ((int)uVar13 < 0) {
      uVar7 = (0xb - uVar13) / 0xc;
      iVar6 = iVar6 + uVar7;
      uVar7 = (uVar7 * 0xc - (0xb - uVar13)) + 0xb;
    }
    uVar13 = iVar6 - (uint)((int)uVar13 < 2);
    iVar8 = 0;
    if (iVar14 == -1) {
      iVar14 = 0;
    }
    *local_68 = (((long)local_74 +
                 ((long)(int)local_90 + (long)(iVar6 + -0x7b2) * 0x16d +
                  (long)*(int *)(my_timegm_month_days_cumulative + (ulong)uVar7 * 4) +
                 (long)(int)(uVar13 / 400 + ((uVar13 >> 2) - uVar13 / 100) + -0x1dd)) * 0x18) * 0x3c
                + (long)local_78) * 0x3c + (long)iVar14 + (long)local_8c + -0x15180;
  }
  return iVar8;
LAB_0012de59:
  iVar6 = (int)local_88;
  output = local_68;
  if (local_8c != -1) goto LAB_0012de7a;
  goto LAB_0012de70;
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  struct my_tm tm;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  tm.tm_sec = secnum;
  tm.tm_min = minnum;
  tm.tm_hour = hournum;
  tm.tm_mday = mdaynum;
  tm.tm_mon = monnum;
  tm.tm_year = yearnum;

  /* my_timegm() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  my_timegm(&tm, &t);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}